

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_normalize(quaternion *self)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  anon_union_16_3_07544b10_for_quaternion_0 aVar4;
  
  fVar2 = quaternion_magnitude(self);
  fVar3 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar3 = fVar2;
  }
  if (1e-05 <= fVar3) {
    auVar1._4_4_ = fVar2;
    auVar1._0_4_ = fVar2;
    auVar1._8_4_ = fVar2;
    auVar1._12_4_ = fVar2;
    aVar4.q = (float  [4])divps(self->field_0,auVar1);
    self->field_0 = aVar4;
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_normalize(struct quaternion *self)
{
	HYP_FLOAT mag;

	mag = quaternion_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x /= mag;
	self->y /= mag;
	self->z /= mag;
	self->w /= mag;

	return self;
}